

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RbuState * rbuLoadState(sqlite3rbu *p)

{
  sqlite3 *db;
  sqlite3_stmt *pStmt_00;
  int iVar1;
  RbuState *pRVar2;
  char *pcVar3;
  Mem *pMVar4;
  i64 iVar5;
  uchar *puVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  int rc;
  sqlite3_stmt *pStmt;
  int local_3c;
  sqlite3_stmt *local_38;
  
  local_38 = (sqlite3_stmt *)0x0;
  pRVar2 = (RbuState *)rbuMalloc(p,0x50);
  if (pRVar2 == (RbuState *)0x0) {
    pRVar2 = (RbuState *)0x0;
  }
  else {
    db = p->dbRbu;
    pcVar3 = sqlite3_mprintf("SELECT k, v FROM %s.rbu_state",p->zStateDb);
    local_3c = prepareFreeAndCollectError(db,&local_38,&p->zErrmsg,pcVar3);
    pStmt_00 = local_38;
    bVar9 = local_3c == 0;
    if ((bVar9) && (iVar1 = sqlite3_step(local_38), iVar1 == 100)) {
      do {
        pMVar4 = columnMem(pStmt_00,0);
        iVar5 = sqlite3VdbeIntValue(pMVar4);
        columnMallocFailure(pStmt_00);
        switch((int)iVar5) {
        case 1:
          pMVar4 = columnMem(pStmt_00,1);
          iVar5 = sqlite3VdbeIntValue(pMVar4);
          columnMallocFailure(pStmt_00);
          uVar8 = (uint)iVar5;
          pRVar2->eStage = uVar8;
          if ((4 < uVar8) || ((0x16U >> (uVar8 & 0x1f) & 1) == 0)) {
            p->rc = 0xb;
          }
          break;
        case 2:
          puVar6 = sqlite3_column_text(pStmt_00,1);
          pcVar3 = rbuStrndup((char *)puVar6,&local_3c);
          pRVar2->zTbl = pcVar3;
          break;
        case 3:
          puVar6 = sqlite3_column_text(pStmt_00,1);
          pcVar3 = rbuStrndup((char *)puVar6,&local_3c);
          pRVar2->zIdx = pcVar3;
          break;
        case 4:
          pMVar4 = columnMem(pStmt_00,1);
          iVar5 = sqlite3VdbeIntValue(pMVar4);
          columnMallocFailure(pStmt_00);
          pRVar2->nRow = (int)iVar5;
          break;
        case 5:
          pMVar4 = columnMem(pStmt_00,1);
          iVar5 = sqlite3VdbeIntValue(pMVar4);
          columnMallocFailure(pStmt_00);
          pRVar2->nProgress = iVar5;
          break;
        case 6:
          pMVar4 = columnMem(pStmt_00,1);
          iVar5 = sqlite3VdbeIntValue(pMVar4);
          columnMallocFailure(pStmt_00);
          pRVar2->iWalCksum = iVar5;
          break;
        case 7:
          pMVar4 = columnMem(pStmt_00,1);
          iVar5 = sqlite3VdbeIntValue(pMVar4);
          columnMallocFailure(pStmt_00);
          pRVar2->iCookie = (u32)iVar5;
          break;
        case 8:
          pMVar4 = columnMem(pStmt_00,1);
          uVar7 = sqlite3VdbeIntValue(pMVar4);
          columnMallocFailure(pStmt_00);
          pRVar2->iOalSz = uVar7 & 0xffffffff;
          break;
        case 9:
          pMVar4 = columnMem(pStmt_00,1);
          iVar5 = sqlite3VdbeIntValue(pMVar4);
          columnMallocFailure(pStmt_00);
          pRVar2->nPhaseOneStep = iVar5;
          break;
        case 10:
          puVar6 = sqlite3_column_text(pStmt_00,1);
          pcVar3 = rbuStrndup((char *)puVar6,&local_3c);
          pRVar2->zDataTbl = pcVar3;
          break;
        default:
          local_3c = 0xb;
        }
        bVar9 = local_3c == 0;
      } while ((bVar9) && (iVar1 = sqlite3_step(pStmt_00), iVar1 == 100));
    }
    iVar1 = sqlite3_finalize(local_38);
    if (bVar9) {
      local_3c = iVar1;
    }
    p->rc = local_3c;
  }
  return pRVar2;
}

Assistant:

static RbuState *rbuLoadState(sqlite3rbu *p){
  RbuState *pRet = 0;
  sqlite3_stmt *pStmt = 0;
  int rc;
  int rc2;

  pRet = (RbuState*)rbuMalloc(p, sizeof(RbuState));
  if( pRet==0 ) return 0;

  rc = prepareFreeAndCollectError(p->dbRbu, &pStmt, &p->zErrmsg, 
      sqlite3_mprintf("SELECT k, v FROM %s.rbu_state", p->zStateDb)
  );
  while( rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pStmt) ){
    switch( sqlite3_column_int(pStmt, 0) ){
      case RBU_STATE_STAGE:
        pRet->eStage = sqlite3_column_int(pStmt, 1);
        if( pRet->eStage!=RBU_STAGE_OAL
         && pRet->eStage!=RBU_STAGE_MOVE
         && pRet->eStage!=RBU_STAGE_CKPT
        ){
          p->rc = SQLITE_CORRUPT;
        }
        break;

      case RBU_STATE_TBL:
        pRet->zTbl = rbuStrndup((char*)sqlite3_column_text(pStmt, 1), &rc);
        break;

      case RBU_STATE_IDX:
        pRet->zIdx = rbuStrndup((char*)sqlite3_column_text(pStmt, 1), &rc);
        break;

      case RBU_STATE_ROW:
        pRet->nRow = sqlite3_column_int(pStmt, 1);
        break;

      case RBU_STATE_PROGRESS:
        pRet->nProgress = sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_CKPT:
        pRet->iWalCksum = sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_COOKIE:
        pRet->iCookie = (u32)sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_OALSZ:
        pRet->iOalSz = (u32)sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_PHASEONESTEP:
        pRet->nPhaseOneStep = sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_DATATBL:
        pRet->zDataTbl = rbuStrndup((char*)sqlite3_column_text(pStmt, 1), &rc);
        break;

      default:
        rc = SQLITE_CORRUPT;
        break;
    }
  }
  rc2 = sqlite3_finalize(pStmt);
  if( rc==SQLITE_OK ) rc = rc2;

  p->rc = rc;
  return pRet;
}